

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall groundupdb::EncodedValue::EncodedValue(EncodedValue *this,string *from)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *from_local;
  EncodedValue *this_local;
  
  this->m_has_value = true;
  this->m_type = CPP;
  local_18 = from;
  from_local = (string *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)from);
  HashedValue::HashedValue<std::__cxx11::string>(&this->m_value,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

EncodedValue(const std::string& from) : m_has_value(true), m_type(Type::CPP), m_value(HashedValue{from}) {}